

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall chrono::ChFrame<double>::ArchiveOUT(ChFrame<double> *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChFrame<double>>(marchive);
  local_28._value = &this->coord;
  local_28._name = "coord";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive) {
        // suggested: use versioning
        marchive.VersionWrite<ChFrame<double>>();
        // stream out all member data
        marchive << CHNVP(coord);
    }